

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::~ForwardEuler(ForwardEuler *this)

{
  undefined8 *in_RDI;
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__ForwardEuler_003fb5f0;
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::~map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
          *)0x3a7b3d);
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::~map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
          *)0x3a7b4e);
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::~map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
          *)0x3a7b5f);
  std::
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ::~vector(unaff_retaddr);
  std::
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ::~vector(unaff_retaddr);
  iDynTree::VectorDynSize::~VectorDynSize((VectorDynSize *)(in_RDI + 0x3c));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0x37));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0x32));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0x2d));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0x28));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0x23));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0x1e));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0x19));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0x14));
  iDynTree::MatrixDynSize::~MatrixDynSize((MatrixDynSize *)(in_RDI + 0xf));
  iDynTree::VectorDynSize::~VectorDynSize((VectorDynSize *)(in_RDI + 0xb));
  FixedStepIntegrator::~FixedStepIntegrator((FixedStepIntegrator *)0x3a7c40);
  return;
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraint(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                             const std::vector<VectorDynSize> &controlInputs,
                                                             double dT, VectorDynSize &constraintValue)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() < 1){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 1 (at least).";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (constraintValue.size() != m_dynamicalSystem_ptr->stateSpaceSize()) {
                    constraintValue.resize(static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize()));
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamics(collocationPoints[0], time, m_computationBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while evaluating the dynamical system.");
                    return false;
                }

                toEigen(constraintValue) = -toEigen(collocationPoints[1]) + toEigen(collocationPoints[0]) +
                        dT*toEigen(m_computationBuffer);

                return true;
            }